

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentsHelper.cxx
# Opt level: O0

bool __thiscall cmCommandArgument::MayFollow(cmCommandArgument *this,cmCommandArgument *current)

{
  _Self local_30;
  _Self local_28;
  cmCommandArgument *local_20;
  cmCommandArgument *current_local;
  cmCommandArgument *this_local;
  
  if ((this->ArgumentsBeforeEmpty & 1U) == 0) {
    local_20 = current;
    current_local = this;
    local_28._M_node =
         (_Base_ptr)
         std::
         set<const_cmCommandArgument_*,_std::less<const_cmCommandArgument_*>,_std::allocator<const_cmCommandArgument_*>_>
         ::find(&this->ArgumentsBefore,&local_20);
    local_30._M_node =
         (_Base_ptr)
         std::
         set<const_cmCommandArgument_*,_std::less<const_cmCommandArgument_*>,_std::allocator<const_cmCommandArgument_*>_>
         ::end(&this->ArgumentsBefore);
    this_local._7_1_ = std::operator!=(&local_28,&local_30);
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool cmCommandArgument::MayFollow(const cmCommandArgument* current) const
{
  if (this->ArgumentsBeforeEmpty) {
    return true;
  }
  return this->ArgumentsBefore.find(current) != this->ArgumentsBefore.end();
}